

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O3

void __thiscall
Resorting::MortonCode64::MortonCode64(MortonCode64 *this,int32_t x,int32_t y,int32_t z)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (0x1fffff < x + 0x100000U) {
    __assert_fail("-(1 << 20) <= x && x < (1 << 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                  ,0x33,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
  }
  if (y + 0x100000U < 0x200000) {
    if (z + 0x100000U < 0x200000) {
      uVar3 = x & 0xfffffU | (uint)x >> 0xb & 0x100000;
      uVar5 = y & 0xfffffU | (uint)y >> 0xb & 0x100000;
      uVar1 = z & 0xfffffU | (uint)z >> 0xb & 0x100000;
      uVar2 = ((ulong)(uint)(x << 0x10) | CONCAT44(uVar3,uVar3) & 0x1f00000000ffff) &
              0x1f0000ff0000ff;
      uVar4 = (uVar2 << 8 | uVar2) & 0x100f00f00f00f00f;
      uVar2 = ((ulong)(uint)(y << 0x10) | CONCAT44(uVar5,uVar5) & 0x1f00000000ffff) &
              0x1f0000ff0000ff;
      uVar6 = (uVar2 << 8 | uVar2) & 0x100f00f00f00f00f;
      uVar2 = ((ulong)(uint)(z << 0x10) | CONCAT44(uVar1,uVar1) & 0x1f00000000ffff) &
              0x1f0000ff0000ff;
      uVar2 = (uVar2 << 8 | uVar2) & 0x100f00f00f00f00f;
      this->data = (((uVar2 << 4 | uVar2) & 0x10c30c30c30c30c3) * 0x14 & 0x4924924924924924 |
                   ((uVar6 << 4 | uVar6) & 0x10c30c30c30c30c3) * 10 & 0x2492492492492492 |
                   ((uVar4 << 4 | uVar4) & 0x10c30c30c30c30c3) * 5 & 0x1249249249249249) ^
                   0x7000000000000000;
      return;
    }
    __assert_fail("-(1 << 20) <= z && z < (1 << 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                  ,0x35,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
  }
  __assert_fail("-(1 << 20) <= y && y < (1 << 20)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                ,0x34,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
}

Assistant:

MortonCode64::MortonCode64(int32_t x, int32_t y, int32_t z)
{
    assert(-(1 << 20) <= x && x < (1 << 20));
    assert(-(1 << 20) <= y && y < (1 << 20));
    assert(-(1 << 20) <= z && z < (1 << 20));
    // move sign bit to bit 20
    x = (x & 0x80000000) >> 11 | (x & 0x0fffff);
    y = (y & 0x80000000) >> 11 | (y & 0x0fffff);
    z = (z & 0x80000000) >> 11 | (z & 0x0fffff);

    data = SplitBy3Bits21(x) | SplitBy3Bits21(y) << 1 | SplitBy3Bits21(z) << 2;
    // invert sign bits
    data = data ^ 0x7000000000000000;

    /*int32_t dx, dy, dz;
    decode(dx, dy, dz);
    assert(x == dx);
    assert(y == dy);
    assert(z == dz);*/
}